

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGB4444ToUVRow_C(uint8_t *src_argb4444,int src_stride_argb4444,uint8_t *dst_u,uint8_t *dst_v,
                      int width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  ushort uVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [13];
  undefined3 uVar29;
  undefined3 uVar30;
  undefined3 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined8 uVar35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined5 uVar38;
  undefined5 uVar39;
  undefined5 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined8 uVar43;
  undefined1 auVar44 [12];
  undefined8 uVar45;
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined8 uVar48;
  undefined1 auVar49 [14];
  undefined8 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  long lVar59;
  undefined1 auVar60 [16];
  byte bVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  undefined1 uVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  ushort uVar70;
  byte bVar71;
  ushort uVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  undefined1 uVar76;
  undefined1 uVar77;
  undefined1 uVar78;
  byte bVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 uVar86;
  undefined1 uVar87;
  undefined1 uVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  
  auVar54 = _DAT_004c8220;
  auVar53 = _DAT_004c8210;
  auVar52 = _DAT_004c8200;
  auVar51 = _DAT_004c8150;
  lVar59 = (long)src_stride_argb4444;
  if (1 < width) {
    iVar57 = 0;
    auVar60 = ZEXT416(0x70ffee);
    do {
      uVar1 = *(ushort *)src_argb4444;
      uVar72 = *(ushort *)((long)src_argb4444 + 2);
      uVar2 = *(ushort *)((long)src_argb4444 + lVar59);
      uVar3 = *(ushort *)((long)src_argb4444 + lVar59 + 2);
      auVar90 = psllw(ZEXT216(uVar1),4);
      auVar91 = auVar90 & auVar53 | ZEXT216(uVar1) & auVar52;
      uVar13 = (ushort)(CONCAT13((char)(uVar72 >> 8),CONCAT12((char)(uVar1 >> 8),uVar1)) >> 0x10);
      uVar70 = CONCAT11((char)uVar72,(char)uVar1);
      auVar90 = psllw(ZEXT216(uVar72),4);
      auVar89 = auVar90 & auVar53 | ZEXT216(uVar72) & auVar52;
      auVar90 = psllw(ZEXT216(uVar2),4);
      auVar90 = auVar90 & auVar53 | ZEXT216(uVar2) & auVar52;
      bVar79 = pavgb(auVar90[0],auVar91[0]);
      uVar80 = pavgb(auVar90[1],auVar91[1]);
      uVar81 = pavgb(auVar90[2],auVar91[2]);
      uVar82 = pavgb(auVar90[3],auVar91[3]);
      uVar83 = pavgb(auVar90[4],auVar91[4]);
      uVar84 = pavgb(auVar90[5],auVar91[5]);
      uVar85 = pavgb(auVar90[6],auVar91[6]);
      uVar86 = pavgb(auVar90[7],auVar91[7]);
      uVar87 = pavgb(auVar90[8],auVar91[8]);
      uVar88 = pavgb(auVar90[9],auVar91[9]);
      uVar29 = CONCAT12(uVar88,CONCAT11(uVar87,uVar86));
      uVar88 = pavgb(auVar90[10],auVar91[10]);
      uVar55 = CONCAT13(uVar88,uVar29);
      uVar88 = pavgb(auVar90[0xb],auVar91[0xb]);
      uVar38 = CONCAT14(uVar88,uVar55);
      uVar88 = pavgb(auVar90[0xc],auVar91[0xc]);
      auVar47[5] = uVar88;
      auVar47._0_5_ = uVar38;
      pavgb(auVar90[0xd],auVar91[0xd]);
      pavgb(auVar90[0xe],auVar91[0xe]);
      pavgb(auVar90[0xf],auVar91[0xf]);
      uVar1 = (ushort)(CONCAT13((char)(uVar3 >> 8),CONCAT12((char)(uVar2 >> 8),uVar2)) >> 0x10);
      uVar72 = CONCAT11((char)uVar3,(char)uVar2);
      auVar90 = psllw(ZEXT216(uVar3),4);
      auVar90 = auVar90 & auVar53 | ZEXT216(uVar3) & auVar52;
      bVar61 = pavgb(auVar90[0],auVar89[0]);
      uVar88 = pavgb(auVar90[1],auVar89[1]);
      uVar62 = pavgb(auVar90[2],auVar89[2]);
      uVar63 = pavgb(auVar90[3],auVar89[3]);
      uVar64 = pavgb(auVar90[4],auVar89[4]);
      uVar65 = pavgb(auVar90[5],auVar89[5]);
      uVar66 = pavgb(auVar90[6],auVar89[6]);
      uVar67 = pavgb(auVar90[7],auVar89[7]);
      uVar68 = pavgb(auVar90[8],auVar89[8]);
      uVar69 = pavgb(auVar90[9],auVar89[9]);
      uVar30 = CONCAT12(uVar69,CONCAT11(uVar68,uVar67));
      uVar69 = pavgb(auVar90[10],auVar89[10]);
      uVar56 = CONCAT13(uVar69,uVar30);
      uVar69 = pavgb(auVar90[0xb],auVar89[0xb]);
      uVar39 = CONCAT14(uVar69,uVar56);
      uVar69 = pavgb(auVar90[0xc],auVar89[0xc]);
      auVar49[5] = uVar69;
      auVar49._0_5_ = uVar39;
      pavgb(auVar90[0xd],auVar89[0xd]);
      pavgb(auVar90[0xe],auVar89[0xe]);
      pavgb(auVar90[0xf],auVar89[0xf]);
      auVar90 = ZEXT416(CONCAT22(uVar13,uVar70)) & auVar54 |
                ZEXT416(CONCAT22(uVar13 >> 4,uVar70 >> 4)) & auVar51;
      auVar89 = ZEXT416(CONCAT22(uVar1,uVar72)) & auVar54 |
                ZEXT416(CONCAT22(uVar1 >> 4,uVar72 >> 4)) & auVar51;
      bVar71 = pavgb(auVar89[0],auVar90[0]);
      uVar69 = pavgb(auVar89[1],auVar90[1]);
      pavgb(auVar89[2],auVar90[2]);
      pavgb(auVar89[3],auVar90[3]);
      uVar73 = pavgb(0,0);
      uVar74 = pavgb(0,0);
      uVar75 = pavgb(0,0);
      uVar76 = pavgb(0,0);
      uVar77 = pavgb(auVar89[8],auVar90[8]);
      uVar78 = pavgb(auVar89[9],auVar90[9]);
      uVar31 = CONCAT12(uVar78,CONCAT11(uVar77,uVar76));
      uVar78 = pavgb(auVar89[10],auVar90[10]);
      uVar58 = CONCAT13(uVar78,uVar31);
      uVar78 = pavgb(auVar89[0xb],auVar90[0xb]);
      uVar40 = CONCAT14(uVar78,uVar58);
      uVar78 = pavgb(auVar89[0xc],auVar90[0xc]);
      auVar46[5] = uVar78;
      auVar46._0_5_ = uVar40;
      pavgb(auVar89[0xd],auVar90[0xd]);
      pavgb(auVar89[0xe],auVar90[0xe]);
      pavgb(auVar89[0xf],auVar90[0xf]);
      auVar46._6_8_ = 0;
      auVar4[0xe] = uVar76;
      auVar4._0_14_ = auVar46 << 0x38;
      auVar41._4_8_ = 0;
      auVar41._0_4_ = uVar58;
      auVar7._12_3_ = (int3)(CONCAT26(auVar4._13_2_,CONCAT15(uVar75,uVar40)) >> 0x28);
      auVar7._0_12_ = auVar41 << 0x38;
      auVar10._10_5_ = (int5)(CONCAT44(auVar7._11_4_,CONCAT13(uVar74,uVar31)) >> 0x18);
      auVar10._0_10_ = (unkuint10)CONCAT11(uVar77,uVar76) << 0x38;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = (uint7)(CONCAT62(auVar10._9_6_,CONCAT11(uVar73,uVar76)) >> 8);
      auVar16._8_7_ = 0;
      auVar16._0_8_ = SUB158(auVar15 << 0x40,7);
      auVar17._9_6_ = 0;
      auVar17._0_9_ = SUB159(auVar16 << 0x38,6);
      auVar18._10_5_ = 0;
      auVar18._0_10_ = SUB1510(auVar17 << 0x30,5);
      auVar19._11_4_ = 0;
      auVar19._0_11_ = SUB1511(auVar18 << 0x28,4);
      auVar20._1_12_ = SUB1512(auVar19 << 0x20,3);
      auVar20[0] = uVar69;
      auVar14[1] = 0;
      auVar14[0] = bVar71;
      auVar14._2_13_ = auVar20;
      uVar58 = (auVar14._0_4_ + (uint)auVar20._0_2_ + 1 & 0xffff) >> 1;
      auVar47._6_8_ = 0;
      auVar5[0xe] = uVar86;
      auVar5._0_14_ = auVar47 << 0x38;
      uVar48 = CONCAT26(auVar5._13_2_,CONCAT15(uVar85,uVar38));
      auVar42._4_8_ = 0;
      auVar42._0_4_ = uVar55;
      auVar8._12_3_ = (int3)((ulong)uVar48 >> 0x28);
      auVar8._0_12_ = auVar42 << 0x38;
      uVar43 = CONCAT44(auVar8._11_4_,CONCAT13(uVar84,uVar29));
      auVar11._10_5_ = (int5)((ulong)uVar43 >> 0x18);
      auVar11._0_10_ = (unkuint10)CONCAT11(uVar87,uVar86) << 0x38;
      uVar32 = CONCAT62(auVar11._9_6_,CONCAT11(uVar83,uVar86));
      auVar21._7_8_ = 0;
      auVar21._0_7_ = (uint7)((ulong)uVar32 >> 8);
      Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),uVar82);
      auVar33._9_6_ = 0;
      auVar33._0_9_ = Var22;
      auVar23._1_10_ = SUB1510(auVar33 << 0x30,5);
      auVar23[0] = uVar81;
      auVar34._11_4_ = 0;
      auVar34._0_11_ = auVar23;
      auVar24._1_12_ = SUB1512(auVar34 << 0x20,3);
      auVar24[0] = uVar80;
      auVar49._6_8_ = 0;
      auVar6[0xe] = uVar67;
      auVar6._0_14_ = auVar49 << 0x38;
      uVar50 = CONCAT26(auVar6._13_2_,CONCAT15(uVar66,uVar39));
      auVar44._4_8_ = 0;
      auVar44._0_4_ = uVar56;
      auVar9._12_3_ = (int3)((ulong)uVar50 >> 0x28);
      auVar9._0_12_ = auVar44 << 0x38;
      uVar45 = CONCAT44(auVar9._11_4_,CONCAT13(uVar65,uVar30));
      auVar12._10_5_ = (int5)((ulong)uVar45 >> 0x18);
      auVar12._0_10_ = (unkuint10)CONCAT11(uVar68,uVar67) << 0x38;
      uVar35 = CONCAT62(auVar12._9_6_,CONCAT11(uVar64,uVar67));
      auVar25._7_8_ = 0;
      auVar25._0_7_ = (uint7)((ulong)uVar35 >> 8);
      Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),uVar63);
      auVar36._9_6_ = 0;
      auVar36._0_9_ = Var26;
      auVar27._1_10_ = SUB1510(auVar36 << 0x30,5);
      auVar27[0] = uVar62;
      auVar37._11_4_ = 0;
      auVar37._0_11_ = auVar27;
      auVar28._1_12_ = SUB1512(auVar37 << 0x20,3);
      auVar28[0] = uVar88;
      auVar90._0_2_ = pavgw((ushort)bVar61,(ushort)bVar79);
      auVar90._2_2_ = pavgw(auVar28._0_2_,auVar24._0_2_);
      auVar90._4_2_ = pavgw(auVar27._0_2_,auVar23._0_2_);
      auVar90._6_2_ = pavgw((short)Var26,(short)Var22);
      auVar90._8_2_ = pavgw((short)((ulong)uVar35 >> 8),(short)((ulong)uVar32 >> 8));
      auVar90._10_2_ = pavgw((short)((ulong)uVar45 >> 0x18),(short)((ulong)uVar43 >> 0x18));
      auVar90._12_2_ = pavgw((short)((ulong)uVar50 >> 0x28),(short)((ulong)uVar48 >> 0x28));
      auVar90._14_2_ = pavgw(auVar6._13_2_ >> 8,auVar5._13_2_ >> 8);
      *dst_u = (uint8_t)(((uint)auVar90._2_2_ * 0xffda ^ 0x8000) + (uint)auVar90._0_2_ * 0x70 +
                         uVar58 * 0xffb6 >> 8);
      pmulhuw(auVar90,auVar60);
      *dst_v = (uint8_t)((uVar58 * 0xffa2 ^ 0x8000) +
                         (uint)(ushort)(auVar90._0_2_ * auVar60._0_2_) +
                         (uint)(ushort)(auVar90._2_2_ * auVar60._2_2_) >> 8);
      src_argb4444 = (uint8_t *)((long)src_argb4444 + 4);
      dst_u = dst_u + 1;
      dst_v = dst_v + 1;
      iVar57 = iVar57 + 2;
    } while (iVar57 < width + -1);
  }
  if ((width & 1U) != 0) {
    bVar61 = (byte)*(ushort *)src_argb4444;
    bVar71 = *(byte *)(lVar59 + (long)src_argb4444);
    bVar79 = ((byte *)(lVar59 + (long)src_argb4444))[1];
    uVar58 = (uint)(byte)(bVar71 << 4 | bVar71 & 0xf) + (uint)(byte)(bVar61 << 4 | bVar61 & 0xf) + 1
             >> 1 & 0xff;
    uVar56 = (uint)(byte)(bVar71 & 0xf0 | bVar71 >> 4) + (uint)(byte)(bVar61 & 0xf0 | bVar61 >> 4) +
             1 >> 1 & 0xff;
    uVar55 = (uint)(byte)(bVar79 << 4 | bVar79 & 0xf) +
             (uint)(byte)(*(byte *)((long)src_argb4444 + 1) << 4 |
                         *(byte *)((long)src_argb4444 + 1) & 0xf) + 1 >> 1 & 0xff;
    *dst_u = (uint8_t)((uVar55 * 0xffda ^ 0x8000) + uVar56 * 0xffb6 + uVar58 * 0x70 >> 8);
    *dst_v = (uint8_t)((uVar56 * 0xffa2 ^ 0x8000) + uVar58 * 0xffee + uVar55 * 0x70 >> 8);
  }
  return;
}

Assistant:

void ARGB4444ToUVRow_C(const uint8_t* src_argb4444,
                       int src_stride_argb4444,
                       uint8_t* dst_u,
                       uint8_t* dst_v,
                       int width) {
  const uint8_t* next_argb4444 = src_argb4444 + src_stride_argb4444;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb4444[0] & 0x0f;
    uint8_t g0 = src_argb4444[0] >> 4;
    uint8_t r0 = src_argb4444[1] & 0x0f;
    uint8_t b1 = src_argb4444[2] & 0x0f;
    uint8_t g1 = src_argb4444[2] >> 4;
    uint8_t r1 = src_argb4444[3] & 0x0f;
    uint8_t b2 = next_argb4444[0] & 0x0f;
    uint8_t g2 = next_argb4444[0] >> 4;
    uint8_t r2 = next_argb4444[1] & 0x0f;
    uint8_t b3 = next_argb4444[2] & 0x0f;
    uint8_t g3 = next_argb4444[2] >> 4;
    uint8_t r3 = next_argb4444[3] & 0x0f;

    b0 = (b0 << 4) | b0;
    g0 = (g0 << 4) | g0;
    r0 = (r0 << 4) | r0;
    b1 = (b1 << 4) | b1;
    g1 = (g1 << 4) | g1;
    r1 = (r1 << 4) | r1;
    b2 = (b2 << 4) | b2;
    g2 = (g2 << 4) | g2;
    r2 = (r2 << 4) | r2;
    b3 = (b3 << 4) | b3;
    g3 = (g3 << 4) | g3;
    r3 = (r3 << 4) | r3;

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(AVGB(b0, b2), AVGB(b1, b3));
    uint8_t ag = AVGB(AVGB(g0, g2), AVGB(g1, g3));
    uint8_t ar = AVGB(AVGB(r0, r2), AVGB(r1, r3));
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = (b0 + b1 + b2 + b3 + 1) >> 1;
    uint16_t g = (g0 + g1 + g2 + g3 + 1) >> 1;
    uint16_t r = (r0 + r1 + r2 + r3 + 1) >> 1;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif

    src_argb4444 += 4;
    next_argb4444 += 4;
    dst_u += 1;
    dst_v += 1;
  }
  if (width & 1) {
    uint8_t b0 = src_argb4444[0] & 0x0f;
    uint8_t g0 = src_argb4444[0] >> 4;
    uint8_t r0 = src_argb4444[1] & 0x0f;
    uint8_t b2 = next_argb4444[0] & 0x0f;
    uint8_t g2 = next_argb4444[0] >> 4;
    uint8_t r2 = next_argb4444[1] & 0x0f;

    b0 = (b0 << 4) | b0;
    g0 = (g0 << 4) | g0;
    r0 = (r0 << 4) | r0;
    b2 = (b2 << 4) | b2;
    g2 = (g2 << 4) | g2;
    r2 = (r2 << 4) | r2;

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(b0, b2);
    uint8_t ag = AVGB(g0, g2);
    uint8_t ar = AVGB(r0, r2);
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = b0 + b2;
    uint16_t g = g0 + g2;
    uint16_t r = r0 + r2;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif
  }
}